

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O0

void __thiscall WSNTopologyBasedEnergy::LinkNodeEachLayer(WSNTopologyBasedEnergy *this)

{
  double *pdVar1;
  int iVar2;
  bool bVar3;
  size_type sVar4;
  size_type sVar5;
  reference pWVar6;
  pointer pWVar7;
  double dVar8;
  double dVar9;
  _InputArray local_280;
  allocator<char> local_261;
  string local_260 [32];
  Scalar_<double> local_240;
  __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_> local_220;
  __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_> local_218;
  Point_<int> local_210;
  Point_<int> local_208;
  _InputOutputArray local_200;
  __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_> local_1e8;
  __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_> local_1e0;
  WSNNode *local_1d8;
  WSNNode *local_1d0;
  __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_> local_1c8;
  const_iterator local_1c0;
  WSNNode *local_1b8;
  const_iterator local_1b0;
  WSNNode *local_1a8;
  WSNNode local_1a0;
  __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_> local_168;
  __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_> local_160;
  WSNNode local_158;
  WSNNode local_120;
  __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_> local_e8;
  __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_> local_e0;
  WSNNode local_d8;
  __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_> local_a0;
  WSNNode *local_98;
  __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_> local_90;
  iterator p;
  undefined1 local_80 [8];
  WSNNode NextNode;
  iterator it;
  int temp1cap;
  int local_2c;
  undefined1 local_28 [4];
  int i;
  vector<WSNNode,_std::allocator<WSNNode>_> temp1;
  WSNTopologyBasedEnergy *this_local;
  
  temp1.super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::vector<WSNNode,_std::allocator<WSNNode>_>::vector
            ((vector<WSNNode,_std::allocator<WSNNode>_> *)local_28);
  for (local_2c = 0; local_2c < 5; local_2c = local_2c + 1) {
    std::vector<WSNNode,_std::allocator<WSNNode>_>::operator=
              ((vector<WSNNode,_std::allocator<WSNNode>_> *)local_28,this->layer + local_2c);
    sVar4 = std::vector<WSNNode,_std::allocator<WSNNode>_>::size
                      ((vector<WSNNode,_std::allocator<WSNNode>_> *)local_28);
    std::vector<WSNNode,_std::allocator<WSNNode>_>::clear(this->LayerLeaderSeq + local_2c);
    std::vector<WSNNode,_std::allocator<WSNNode>_>::push_back
              (this->LayerLeaderSeq + local_2c,this->LayerFirstLinkNode + local_2c);
    __gnu_cxx::__normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>::
    __normal_iterator((__normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>
                       *)(NextNode.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3));
    while( true ) {
      sVar5 = std::vector<WSNNode,_std::allocator<WSNNode>_>::size(this->LayerLeaderSeq + local_2c);
      if ((int)sVar4 + 1 <= sVar5) break;
      p = std::vector<WSNNode,_std::allocator<WSNNode>_>::begin
                    ((vector<WSNNode,_std::allocator<WSNNode>_> *)local_28);
      pWVar6 = __gnu_cxx::
               __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>::
               operator*(&p);
      WSNNode::WSNNode((WSNNode *)local_80,pWVar6);
      __gnu_cxx::__normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>::
      __normal_iterator(&local_90);
      local_98 = (WSNNode *)
                 std::vector<WSNNode,_std::allocator<WSNNode>_>::begin
                           ((vector<WSNNode,_std::allocator<WSNNode>_> *)local_28);
      NextNode.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = (double)local_98;
      while( true ) {
        local_a0._M_current =
             (WSNNode *)
             std::vector<WSNNode,_std::allocator<WSNNode>_>::end
                       ((vector<WSNNode,_std::allocator<WSNNode>_> *)local_28);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>
                            *)(NextNode.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3)
                           ,&local_a0);
        if (!bVar3) break;
        local_e8._M_current =
             (WSNNode *)
             std::vector<WSNNode,_std::allocator<WSNNode>_>::end(this->LayerLeaderSeq + local_2c);
        local_e0 = __gnu_cxx::
                   __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>::
                   operator-(&local_e8,1);
        pWVar6 = __gnu_cxx::
                 __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>::
                 operator*(&local_e0);
        WSNNode::WSNNode(&local_d8,pWVar6);
        pWVar6 = __gnu_cxx::
                 __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>::
                 operator*((__normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>
                            *)(NextNode.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3)
                          );
        WSNNode::WSNNode(&local_120,pWVar6);
        dVar8 = DistanceBetweenNodes(this,&local_d8,&local_120);
        local_168._M_current =
             (WSNNode *)
             std::vector<WSNNode,_std::allocator<WSNNode>_>::end(this->LayerLeaderSeq + local_2c);
        local_160 = __gnu_cxx::
                    __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>::
                    operator-(&local_168,1);
        pWVar6 = __gnu_cxx::
                 __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>::
                 operator*(&local_160);
        WSNNode::WSNNode(&local_158,pWVar6);
        WSNNode::WSNNode(&local_1a0,(WSNNode *)local_80);
        dVar9 = DistanceBetweenNodes(this,&local_158,&local_1a0);
        WSNNode::~WSNNode(&local_1a0);
        WSNNode::~WSNNode(&local_158);
        WSNNode::~WSNNode(&local_120);
        WSNNode::~WSNNode(&local_d8);
        if (dVar8 <= dVar9) {
          pWVar6 = __gnu_cxx::
                   __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>::
                   operator*((__normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>
                              *)(NextNode.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val +
                                3));
          WSNNode::operator=((WSNNode *)local_80,pWVar6);
          local_90._M_current =
               (WSNNode *)NextNode.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3];
        }
        local_1a8 = (WSNNode *)
                    __gnu_cxx::
                    __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>::
                    operator++((__normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>
                                *)(NextNode.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val
                                  + 3),0);
      }
      std::vector<WSNNode,_std::allocator<WSNNode>_>::push_back
                (this->LayerLeaderSeq + local_2c,(value_type *)local_80);
      __gnu_cxx::__normal_iterator<WSNNode_const*,std::vector<WSNNode,std::allocator<WSNNode>>>::
      __normal_iterator<WSNNode*>
                ((__normal_iterator<WSNNode_const*,std::vector<WSNNode,std::allocator<WSNNode>>> *)
                 &local_1b0,&local_90);
      local_1b8 = (WSNNode *)
                  std::vector<WSNNode,_std::allocator<WSNNode>_>::erase
                            ((vector<WSNNode,_std::allocator<WSNNode>_> *)local_28,local_1b0);
      WSNNode::~WSNNode((WSNNode *)local_80);
    }
    local_1c8._M_current =
         (WSNNode *)
         std::vector<WSNNode,_std::allocator<WSNNode>_>::begin(this->LayerLeaderSeq + local_2c);
    __gnu_cxx::__normal_iterator<WSNNode_const*,std::vector<WSNNode,std::allocator<WSNNode>>>::
    __normal_iterator<WSNNode*>
              ((__normal_iterator<WSNNode_const*,std::vector<WSNNode,std::allocator<WSNNode>>> *)
               &local_1c0,&local_1c8);
    local_1d0 = (WSNNode *)
                std::vector<WSNNode,_std::allocator<WSNNode>_>::erase
                          (this->LayerLeaderSeq + local_2c,local_1c0);
    local_1d8 = (WSNNode *)
                std::vector<WSNNode,_std::allocator<WSNNode>_>::begin
                          (this->LayerLeaderSeq + local_2c);
    NextNode.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = (double)local_1d8;
    while( true ) {
      local_1e8._M_current =
           (WSNNode *)
           std::vector<WSNNode,_std::allocator<WSNNode>_>::end(this->LayerLeaderSeq + local_2c);
      local_1e0 = __gnu_cxx::
                  __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>::
                  operator-(&local_1e8,1);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>
                          *)(NextNode.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3),
                         &local_1e0);
      if (!bVar3) break;
      cv::_InputOutputArray::_InputOutputArray(&local_200,&this->img);
      pdVar1 = NextNode.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3;
      pWVar7 = __gnu_cxx::
               __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>::
               operator->((__normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>
                           *)pdVar1);
      iVar2 = pWVar7->x;
      pWVar7 = __gnu_cxx::
               __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>::
               operator->((__normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>
                           *)pdVar1);
      cv::Point_<int>::Point_(&local_208,iVar2,pWVar7->y);
      pdVar1 = NextNode.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3;
      local_218 = __gnu_cxx::
                  __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>::
                  operator+((__normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>
                             *)pdVar1,1);
      pWVar7 = __gnu_cxx::
               __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>::
               operator->(&local_218);
      iVar2 = pWVar7->x;
      local_220 = __gnu_cxx::
                  __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>::
                  operator+((__normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>
                             *)pdVar1,1);
      pWVar7 = __gnu_cxx::
               __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>::
               operator->(&local_220);
      cv::Point_<int>::Point_(&local_210,iVar2,pWVar7->y);
      cv::Scalar_<double>::Scalar_(&local_240,155.0,155.0,155.0,0.0);
      cv::line(&local_200,&local_208,&local_210,&local_240,1,8,0);
      cv::_InputOutputArray::~_InputOutputArray(&local_200);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_260,"WSN",&local_261);
      cv::_InputArray::_InputArray(&local_280,&this->img);
      cv::imshow(local_260,&local_280);
      cv::_InputArray::~_InputArray(&local_280);
      std::__cxx11::string::~string(local_260);
      std::allocator<char>::~allocator(&local_261);
      if ((this->Test & 1U) == 1) {
        cv::waitKey(0x1e);
      }
      __gnu_cxx::__normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>::
      operator++((__normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_> *)
                 (NextNode.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3),0);
    }
    if ((this->Test & 1U) == 1) {
      cv::waitKey(200);
    }
  }
  if ((this->Test & 1U) == 1) {
    cv::waitKey(0);
  }
  std::vector<WSNNode,_std::allocator<WSNNode>_>::~vector
            ((vector<WSNNode,_std::allocator<WSNNode>_> *)local_28);
  return;
}

Assistant:

void WSNTopologyBasedEnergy::LinkNodeEachLayer()
{
	vector<WSNNode> temp1;

	for(int i=0;i<LayerNum;i++)
	{
		temp1=layer[i];
		int temp1cap=temp1.size();
		LayerLeaderSeq[i].clear();
		LayerLeaderSeq[i].push_back(LayerFirstLinkNode[i]);
		vector<WSNNode>::iterator it;


		//生成距离数组
		while( LayerLeaderSeq[i].size() < (unsigned int)(temp1cap+1))
		{
			WSNNode NextNode=*(temp1.begin());
			vector<WSNNode>::iterator p;

			for(it=temp1.begin();it!=temp1.end();it++)
			{
				if( DistanceBetweenNodes(*(LayerLeaderSeq[i].end()-1) ,*it) <= 
					DistanceBetweenNodes(*(LayerLeaderSeq[i].end()-1),NextNode)  )
				{
					NextNode=*it;	
					p=it;
				}
			}

			LayerLeaderSeq[i].push_back(NextNode);
			temp1.erase(p);
		}


		//成链
		LayerLeaderSeq[i].erase(LayerLeaderSeq[i].begin());

		for(it=LayerLeaderSeq[i].begin();it!=LayerLeaderSeq[i].end()-1;it++)
		{
			line(img, Point(it->x,it->y), Point((it+1)->x,(it+1)->y), Scalar(155,155,155),1,8,0);  
			imshow("WSN",img);
			if(true==Test) waitKey(30);
		}
		if(true==Test) waitKey(200);
	}
	if(true==Test) waitKey();
}